

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::ResetPolymorphicCallSiteInfo
          (DynamicProfileInfo *this,ProfileId callSiteId,LocalFunctionId functionId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CallSiteInfo **ppCVar4;
  LocalFunctionId functionId_local;
  ProfileId callSiteId_local;
  DynamicProfileInfo *this_local;
  
  bVar2 = CCLock::IsLocked((CCLock *)callSiteInfoCS);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x35b,"(this->callSiteInfoCS.IsLocked())",
                                "this->callSiteInfoCS.IsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppCVar4 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  *(ushort *)&(*ppCVar4)[callSiteId].field_0x2 =
       *(ushort *)&(*ppCVar4)[callSiteId].field_0x2 & 0x7fff;
  ppCVar4 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  (*ppCVar4)[callSiteId].u.functionData.sourceId = 0xfffffffd;
  ppCVar4 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  (*ppCVar4)[callSiteId].u.functionData.functionId = functionId;
  this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
  return;
}

Assistant:

void DynamicProfileInfo::ResetPolymorphicCallSiteInfo(ProfileId callSiteId, Js::LocalFunctionId functionId)
    {
        Assert(this->callSiteInfoCS.IsLocked());

        callSiteInfo[callSiteId].isPolymorphic = false;
        callSiteInfo[callSiteId].u.functionData.sourceId = CurrentSourceId;
        callSiteInfo[callSiteId].u.functionData.functionId = functionId;
        this->currentInlinerVersion++;
    }